

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O0

void __thiscall
cmGlobalGenerator::FrameworkDescriptor::~FrameworkDescriptor(FrameworkDescriptor *this)

{
  FrameworkDescriptor *this_local;
  
  std::__cxx11::string::~string((string *)&this->Suffix);
  std::__cxx11::string::~string((string *)&this->Name);
  std::__cxx11::string::~string((string *)&this->Version);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FrameworkDescriptor(std::string directory, std::string name)
      : Directory(std::move(directory))
      , Name(std::move(name))
    {
    }